

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O1

void nsync_mu_semaphore_p(nsync_semaphore *s)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  
  do {
    while (iVar1 = *(int *)s->sem_space, iVar1 == 0) {
      lVar2 = syscall(0xca,s,0x189,0,0,0,0xffffffff);
      if ((int)lVar2 != 0) {
        piVar3 = __errno_location();
        if ((*piVar3 != 4) && (*piVar3 != 0xb)) {
          _DAT_00000000 = 0;
        }
      }
    }
    LOCK();
    bVar4 = iVar1 == *(int *)s->sem_space;
    if (bVar4) {
      *(int *)s->sem_space = iVar1 + -1;
    }
    UNLOCK();
  } while (!bVar4);
  return;
}

Assistant:

void nsync_mu_semaphore_p (nsync_semaphore *s) {
	struct futex *f = (struct futex *) s;
	int i;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
                        int futex_result = futex (&f->i, FUTEX_WAIT_, i, NULL,
                                                  NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR ||
				errno == EWOULDBLOCK);
		}
	} while (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i-1));
}